

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walIndexPage(Wal *pWal,int iPage,u32 **ppPage)

{
  int iVar1;
  int iVar2;
  u32 *puVar3;
  u32 **ppuVar4;
  long lVar5;
  
  lVar5 = (long)iPage;
  if (iPage < pWal->nWiData) {
    ppuVar4 = pWal->apWiData;
LAB_0012304b:
    iVar2 = 0;
    if (ppuVar4[lVar5] == (u32 *)0x0) {
      if (pWal->exclusiveMode == '\x02') {
        puVar3 = (u32 *)sqlite3Malloc(0x8000);
        if (puVar3 != (u32 *)0x0) {
          memset(puVar3,0,0x8000);
        }
        pWal->apWiData[lVar5] = puVar3;
        iVar2 = 7;
        if (pWal->apWiData[lVar5] != (u32 *)0x0) {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = (*pWal->pDbFd->pMethods->xShmMap)
                          (pWal->pDbFd,iPage,0x8000,(int)pWal->writeLock,ppuVar4 + lVar5);
        if (iVar2 == 8) {
          pWal->readOnly = pWal->readOnly | 2;
          iVar2 = 0;
        }
      }
    }
    puVar3 = pWal->apWiData[lVar5];
  }
  else {
    ppuVar4 = pWal->apWiData;
    iVar1 = sqlite3_initialize();
    iVar2 = 7;
    if (iVar1 == 0) {
      iVar1 = (int)(lVar5 + 1);
      ppuVar4 = (u32 **)sqlite3Realloc(ppuVar4,(long)(iVar1 * 8));
      if (ppuVar4 != (u32 **)0x0) {
        memset(ppuVar4 + pWal->nWiData,0,((lVar5 + 1) - (long)pWal->nWiData) * 8);
        pWal->apWiData = ppuVar4;
        pWal->nWiData = iVar1;
        goto LAB_0012304b;
      }
    }
    puVar3 = (u32 *)0x0;
  }
  *ppPage = puVar3;
  return iVar2;
}

Assistant:

static int walIndexPage(Wal *pWal, int iPage, volatile u32 **ppPage){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    int nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3_realloc64((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM_BKPT;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  if( pWal->apWiData[iPage]==0 ){
    if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
      pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
      if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ, 
          pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
      );
      if( rc==SQLITE_READONLY ){
        pWal->readOnly |= WAL_SHM_RDONLY;
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}